

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_op.hpp
# Opt level: O0

want __thiscall
asio::ssl::detail::write_op<asio::const_buffers_1>::operator()
          (write_op<asio::const_buffers_1> *this,engine *eng,error_code *ec,
          size_t *bytes_transferred)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *in_RDX;
  engine *in_RSI;
  const_buffer *in_RDI;
  const_buffer buffer;
  uchar storage [1];
  mutable_buffer *in_stack_ffffffffffffff98;
  const_buffer local_48;
  const_buffer local_38;
  size_t local_20;
  void *local_18;
  engine *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  buffer<unsigned_char,1ul>((uchar (*) [1])0x3f9dfc);
  const_buffer::const_buffer(in_RDI,in_stack_ffffffffffffff98);
  local_38 = asio::detail::buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::
             linearise((const_buffers_1 *)in_RDI,&local_48);
  sVar1 = engine::write(local_10,(int)&local_38,local_18,local_20);
  return (want)sVar1;
}

Assistant:

engine::want operator()(engine& eng,
      asio::error_code& ec,
      std::size_t& bytes_transferred) const
  {
    unsigned char storage[
      asio::detail::buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence>::linearisation_storage_size];

    asio::const_buffer buffer =
      asio::detail::buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence>::linearise(buffers_, asio::buffer(storage));

    return eng.write(buffer, ec, bytes_transferred);
  }